

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>,duckdb::string_t,duckdb::QuantileListOperation<duckdb::string_t,true>>
               (string_t *idata,AggregateInputData *aggr_input_data,
               QuantileState<duckdb::string_t,_duckdb::QuantileStringType> **states,
               ValidityMask *mask,idx_t count)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  unsigned_long *puVar5;
  ulong uVar6;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  ulong uVar19;
  ulong uVar20;
  idx_t iVar21;
  char **ppcVar22;
  ulong uVar23;
  ulong uVar24;
  string_t element;
  string_t element_00;
  string_t element_01;
  ulong local_60;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      ppcVar22 = &(idata->value).pointer.ptr;
      iVar21 = 0;
      do {
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar22 + -1);
        uVar4 = paVar1->length;
        uVar9 = paVar1->prefix[0];
        uVar12 = paVar1->prefix[1];
        uVar15 = paVar1->prefix[2];
        uVar18 = paVar1->prefix[3];
        element_01.value.pointer.prefix[3] = uVar18;
        element_01.value.pointer.prefix[2] = uVar15;
        element_01.value.pointer.prefix[1] = uVar12;
        element_01.value.pointer.prefix[0] = uVar9;
        element_01.value.pointer.length = uVar4;
        element_01.value.pointer.ptr = *ppcVar22;
        QuantileState<duckdb::string_t,_duckdb::QuantileStringType>::AddElement
                  (states[iVar21],element_01,aggr_input_data);
        iVar21 = iVar21 + 1;
        ppcVar22 = ppcVar22 + 2;
      } while (count != iVar21);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_60 = 0;
    uVar23 = 0;
    do {
      puVar5 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        uVar19 = uVar23 + 0x40;
        if (count <= uVar23 + 0x40) {
          uVar19 = count;
        }
LAB_00e1ee67:
        uVar20 = uVar23;
        if (uVar23 < uVar19) {
          ppcVar22 = &idata[uVar23].value.pointer.ptr;
          do {
            paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar22 + -1);
            uVar3 = paVar1->length;
            uVar8 = paVar1->prefix[0];
            uVar11 = paVar1->prefix[1];
            uVar14 = paVar1->prefix[2];
            uVar17 = paVar1->prefix[3];
            element_00.value.pointer.prefix[3] = uVar17;
            element_00.value.pointer.prefix[2] = uVar14;
            element_00.value.pointer.prefix[1] = uVar11;
            element_00.value.pointer.prefix[0] = uVar8;
            element_00.value.pointer.length = uVar3;
            element_00.value.pointer.ptr = *ppcVar22;
            QuantileState<duckdb::string_t,_duckdb::QuantileStringType>::AddElement
                      (states[uVar23],element_00,aggr_input_data);
            uVar23 = uVar23 + 1;
            ppcVar22 = ppcVar22 + 2;
            uVar20 = uVar19;
          } while (uVar19 != uVar23);
        }
      }
      else {
        uVar6 = puVar5[local_60];
        uVar19 = uVar23 + 0x40;
        if (count <= uVar23 + 0x40) {
          uVar19 = count;
        }
        if (uVar6 == 0xffffffffffffffff) goto LAB_00e1ee67;
        uVar20 = uVar19;
        if ((uVar6 != 0) && (uVar20 = uVar23, uVar23 < uVar19)) {
          ppcVar22 = &idata[uVar23].value.pointer.ptr;
          uVar24 = 0;
          do {
            if ((uVar6 >> (uVar24 & 0x3f) & 1) != 0) {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar22 + -1);
              uVar2 = paVar1->length;
              uVar7 = paVar1->prefix[0];
              uVar10 = paVar1->prefix[1];
              uVar13 = paVar1->prefix[2];
              uVar16 = paVar1->prefix[3];
              element.value.pointer.prefix[3] = uVar16;
              element.value.pointer.prefix[2] = uVar13;
              element.value.pointer.prefix[1] = uVar10;
              element.value.pointer.prefix[0] = uVar7;
              element.value.pointer.length = uVar2;
              element.value.pointer.ptr = *ppcVar22;
              QuantileState<duckdb::string_t,_duckdb::QuantileStringType>::AddElement
                        (states[uVar23 + uVar24],element,aggr_input_data);
            }
            uVar24 = uVar24 + 1;
            ppcVar22 = ppcVar22 + 2;
            uVar20 = uVar19;
          } while (uVar19 - uVar23 != uVar24);
        }
      }
      local_60 = local_60 + 1;
      uVar23 = uVar20;
    } while (local_60 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}